

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_BitwiseAnd(BitwiseAndForm2 BitwiseAnd)

{
  bool bVar1;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  ImageTemplate<unsigned_char> local_30;
  
  Unit_Test::intensityArray(&local_48,3);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_30,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&local_60,&local_48,&local_30);
  local_30._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_30);
  (*BitwiseAnd)(local_60.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
                local_60.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1,
                local_60.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2);
  bVar1 = Unit_Test::verifyImage
                    (local_60.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2,
                     local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1] &
                     *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_60);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form2_BitwiseAnd(BitwiseAndForm2 BitwiseAnd)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image = uniformImages( intensity );

        BitwiseAnd( image[0], image[1], image[2] );

        return verifyImage( image[2], intensity[0] & intensity[1] );
    }